

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.hpp
# Opt level: O1

void __thiscall
covec::Covec<float>::
update_batch_thread<__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>*,std::vector<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>,std::allocator<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
          (Covec<float> *this,
          __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          beg,__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              end,__normal_iterator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_*,_std::vector<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_>_>_>
                  gbeg,
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *gen)

{
  discrete_distribution<int> *__param;
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  pointer ppVar4;
  long lVar5;
  long lVar6;
  result_type rVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  long lVar11;
  vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
  *grad;
  size_t sVar12;
  __normal_iterator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_*,_std::vector<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>_>_>_>
  grad_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> negative_sample;
  uniform_int_distribution<unsigned_long> keep_rate_dist;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  uniform_int_distribution<unsigned_long> local_40;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_58,
             (long)(this->num_entries_).
                   super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->num_entries_).
                   super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_40);
  local_40._M_param._M_b = this->dim_;
  local_40._M_param._M_a = 1;
  grad_00._M_current = gbeg._M_current;
  if (beg._M_current != end._M_current) {
    do {
      if (this->chopout_enabled_ == true) {
        sVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                          (&local_40,gen,&local_40._M_param);
      }
      else {
        sVar8 = this->dim_;
      }
      accumulate_grad<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>>
                (this,grad_00._M_current,beg._M_current,POSITIVE,sVar8);
      sVar10 = this->neg_size_;
      grad_00._M_current = grad_00._M_current + 1;
      if (sVar10 != 0) {
        sVar12 = 0;
        do {
          lVar9 = (long)(this->num_entries_).
                        super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->num_entries_).
                        super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          if (lVar9 != 0) {
            lVar9 = lVar9 >> 4;
            lVar9 = lVar9 + (ulong)(lVar9 == 0);
            lVar11 = 0;
            do {
              __param = *(discrete_distribution<int> **)
                         ((long)&(((this->probs_).
                                   super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<std::discrete_distribution<int>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar11 * 2);
              rVar7 = std::discrete_distribution<int>::operator()(__param,gen,&__param->_M_param);
              *(long *)((long)local_58.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar11) = (long)rVar7;
              lVar11 = lVar11 + 8;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          accumulate_grad<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>>
                    (this,grad_00._M_current,&local_58,NEGATIVE,sVar8);
          sVar12 = sVar12 + 1;
          grad_00._M_current = grad_00._M_current + 1;
        } while (sVar12 != sVar10);
      }
      beg._M_current = beg._M_current + 1;
    } while (beg._M_current != end._M_current);
  }
  if (grad_00._M_current != gbeg._M_current) {
    psVar1 = (this->num_entries_).
             super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->num_entries_).
             super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar9 = (long)psVar2 - (long)psVar1 >> 4;
    psVar3 = (this->vs_).
             super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar8 = this->dim_;
    do {
      if (psVar2 != psVar1) {
        ppVar4 = ((gbeg._M_current)->
                 super__Vector_base<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar11 = 0;
        do {
          if (sVar8 != 0) {
            lVar5 = *(long *)&ppVar4[lVar11].second.
                              super__Vector_base<float,_std::allocator<float>_>._M_impl;
            lVar6 = *(long *)(*(long *)&(psVar3[lVar11].
                                         super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->
                                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             + ppVar4[lVar11].first * 0x18);
            sVar10 = 0;
            do {
              *(float *)(lVar6 + sVar10 * 4) =
                   *(float *)(lVar5 + sVar10 * 4) + *(float *)(lVar6 + sVar10 * 4);
              sVar10 = sVar10 + 1;
            } while (sVar8 != sVar10);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != lVar9 + (ulong)(lVar9 == 0));
      }
      gbeg._M_current = gbeg._M_current + 1;
    } while (gbeg._M_current != grad_00._M_current);
  }
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Covec<Real>::update_batch_thread(InputIterator beg, InputIterator end,
                                        GradIterator gbeg,
                                        RandomGenerator& gen)
  {
    // accumulate gradients
    std::vector<std::size_t> negative_sample(this->order());
    
    auto gitr = gbeg;
    std::uniform_int_distribution<std::size_t> keep_rate_dist(1, this->dimension());
    for(auto itr = beg; itr != end; ++itr){
      std::size_t K = this->dimension();
      if(this->chopout_enabled()){
	K = keep_rate_dist(gen);
      }
      // gradient from positive sample
      assert(gitr->size() == order() );
      assert( itr->size() == order() );
      accumulate_grad(*gitr, *itr, POSITIVE, K);
      ++gitr;
      // gradient(s) from negative sample      
      for(std::size_t m = 0, M = this->neg_size(); m < M; ++m){
        for(std::size_t i = 0, I = this->order(); i < I; ++i){
          std::size_t j = this->probs_[i]->operator()(gen);
          negative_sample[i] = j;
        }
        assert( negative_sample.size() == order() );
        accumulate_grad(*gitr, negative_sample, NEGATIVE, K);
        ++gitr;
      }
    }
    auto gend = gitr;      
    
    // update
    for(gitr = gbeg; gitr != gend; ++gitr){
      const auto& grad = *gitr;
      for(std::size_t i = 0, I = this->order(); i < I; ++i){
        auto& vs_i = *this->vs_[i];
        const auto& grad_i = grad[i];
        // update sqgs, vs
        const auto j = grad_i.first;
        const auto& grad_ij = grad_i.second;
        auto& vs_ij = vs_i[j];
        for(std::size_t k = 0, K = this->dimension(); k < K; ++k){
          vs_ij[k] += grad_ij[k];
        }
      }
    }
    
  }